

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O1

void dct2_butterfly_h16_avx2(s16 *src,int i_src,s16 *dst,int line,int shift,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  short sVar19;
  undefined1 auVar20 [32];
  short sVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  __m256i min_val;
  __m256i max_val;
  
  iVar16 = 1 << ((char)shift - 1U & 0x1f);
  if (0 < line) {
    sVar21 = (short)(1 << ((byte)bit_depth & 0x1f));
    sVar19 = sVar21 + -1;
    sVar21 = -sVar21;
    uVar17 = 0;
    do {
      auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)i_src + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 3) + uVar17));
      auVar5 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 5) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 7) + uVar17));
      auVar6 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 9) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xb) + uVar17));
      auVar7 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0xd) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xf) + uVar17));
      auVar27 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)i_src + uVar17),
                               *(undefined1 (*) [16])(src + (long)(i_src * 3) + uVar17));
      auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 5) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 7) + uVar17));
      auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 9) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xb) + uVar17));
      auVar3 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0xd) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xf) + uVar17));
      auVar32._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar4;
      auVar32._16_16_ = ZEXT116(1) * auVar27;
      auVar25 = vpmaddwd_avx2(auVar32,_DAT_0017f220);
      auVar23._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar5;
      auVar23._16_16_ = ZEXT116(1) * auVar1;
      auVar29 = vpmaddwd_avx2(auVar23,_DAT_0017f240);
      auVar25 = vpaddd_avx2(auVar25,auVar29);
      auVar26._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar6;
      auVar26._16_16_ = ZEXT116(1) * auVar2;
      auVar29 = vpmaddwd_avx2(auVar26,_DAT_0017f260);
      auVar28._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar7;
      auVar28._16_16_ = ZEXT116(1) * auVar3;
      auVar30 = vpmaddwd_avx2(auVar28,_DAT_0017f280);
      auVar29 = vpaddd_avx2(auVar29,auVar30);
      auVar25 = vpaddd_avx2(auVar25,auVar29);
      auVar29 = vpmaddwd_avx2(auVar32,_DAT_0017f2a0);
      auVar30 = vpmaddwd_avx2(auVar23,_DAT_0017f2c0);
      auVar29 = vpaddd_avx2(auVar30,auVar29);
      auVar30 = vpmaddwd_avx2(auVar26,_DAT_0017f2e0);
      auVar31 = vpmaddwd_avx2(auVar28,_DAT_0017f300);
      auVar30 = vpaddd_avx2(auVar31,auVar30);
      auVar29 = vpaddd_avx2(auVar29,auVar30);
      auVar30 = vpmaddwd_avx2(auVar32,_DAT_0017f320);
      auVar31 = vpmaddwd_avx2(auVar23,_DAT_0017f340);
      auVar30 = vpaddd_avx2(auVar31,auVar30);
      auVar31 = vpmaddwd_avx2(auVar26,_DAT_0017f360);
      auVar8 = vpmaddwd_avx2(auVar28,_DAT_0017f380);
      auVar31 = vpaddd_avx2(auVar8,auVar31);
      auVar30 = vpaddd_avx2(auVar30,auVar31);
      auVar31 = vpmaddwd_avx2(auVar32,_DAT_0017f3a0);
      auVar8 = vpmaddwd_avx2(auVar23,_DAT_0017f3c0);
      auVar31 = vpaddd_avx2(auVar8,auVar31);
      auVar8 = vpmaddwd_avx2(auVar26,_DAT_0017f3e0);
      auVar9 = vpmaddwd_avx2(auVar28,_DAT_0017f400);
      auVar8 = vpaddd_avx2(auVar9,auVar8);
      auVar31 = vpaddd_avx2(auVar31,auVar8);
      auVar8 = vpmaddwd_avx2(auVar32,_DAT_0017f420);
      auVar9 = vpmaddwd_avx2(auVar23,_DAT_0017f440);
      auVar8 = vpaddd_avx2(auVar9,auVar8);
      auVar9 = vpmaddwd_avx2(auVar26,_DAT_0017f460);
      auVar10 = vpmaddwd_avx2(auVar28,_DAT_0017f480);
      auVar9 = vpaddd_avx2(auVar10,auVar9);
      auVar8 = vpaddd_avx2(auVar8,auVar9);
      auVar9 = vpmaddwd_avx2(auVar32,_DAT_0017f4a0);
      auVar10 = vpmaddwd_avx2(auVar23,_DAT_0017f4c0);
      auVar9 = vpaddd_avx2(auVar10,auVar9);
      auVar10 = vpmaddwd_avx2(auVar26,_DAT_0017f4e0);
      auVar11 = vpmaddwd_avx2(auVar28,_DAT_0017f500);
      auVar10 = vpaddd_avx2(auVar11,auVar10);
      auVar9 = vpaddd_avx2(auVar9,auVar10);
      auVar10 = vpmaddwd_avx2(auVar32,_DAT_0017f520);
      auVar11 = vpmaddwd_avx2(auVar23,_DAT_0017f540);
      auVar10 = vpaddd_avx2(auVar11,auVar10);
      auVar11 = vpmaddwd_avx2(auVar26,_DAT_0017f560);
      auVar12 = vpmaddwd_avx2(auVar28,_DAT_0017f580);
      auVar11 = vpaddd_avx2(auVar12,auVar11);
      auVar10 = vpaddd_avx2(auVar10,auVar11);
      auVar11 = vpmaddwd_avx2(auVar32,_DAT_0017f5a0);
      auVar12 = vpmaddwd_avx2(auVar23,_DAT_0017f5c0);
      auVar11 = vpaddd_avx2(auVar12,auVar11);
      auVar12 = vpmaddwd_avx2(auVar26,_DAT_0017f5e0);
      auVar23 = vpmaddwd_avx2(auVar28,_DAT_0017f600);
      auVar12 = vpaddd_avx2(auVar12,auVar23);
      auVar11 = vpaddd_avx2(auVar11,auVar12);
      auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 2) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 6) + uVar17));
      auVar27 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 2) + uVar17),
                               *(undefined1 (*) [16])(src + (long)(i_src * 6) + uVar17));
      auVar5 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 10) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xe) + uVar17));
      auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 10) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xe) + uVar17));
      auVar6 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 4) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xc) + uVar17));
      auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 4) + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xc) + uVar17));
      auVar7 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 8) + uVar17));
      auVar3 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + uVar17),
                              *(undefined1 (*) [16])(src + (long)(i_src * 8) + uVar17));
      auVar18._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar4;
      auVar18._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar27;
      auVar12 = vpmaddwd_avx2(auVar18,_DAT_0017f620);
      auVar22._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar5;
      auVar22._16_16_ = ZEXT116(1) * auVar1;
      auVar23 = vpmaddwd_avx2(auVar22,_DAT_0017f640);
      auVar12 = vpaddd_avx2(auVar23,auVar12);
      auVar23 = vpmaddwd_avx2(auVar18,_DAT_0017f660);
      auVar26 = vpmaddwd_avx2(auVar22,_DAT_0017f680);
      auVar23 = vpaddd_avx2(auVar26,auVar23);
      auVar26 = vpmaddwd_avx2(auVar18,_DAT_0017f6a0);
      auVar28 = vpmaddwd_avx2(auVar22,_DAT_0017f6c0);
      auVar26 = vpaddd_avx2(auVar28,auVar26);
      auVar28 = vpmaddwd_avx2(auVar18,_DAT_0017f6e0);
      auVar13 = vpmaddwd_avx2(auVar22,_DAT_0017f700);
      auVar28 = vpaddd_avx2(auVar13,auVar28);
      auVar20._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar6;
      auVar20._16_16_ = ZEXT116(1) * auVar2;
      auVar18 = vpmaddwd_avx2(auVar20,_DAT_0017f720);
      auVar24._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar7;
      auVar24._16_16_ = ZEXT116(1) * auVar3;
      auVar13._8_2_ = 0x20;
      auVar13._0_8_ = 0x20002000200020;
      auVar13._10_2_ = 0x20;
      auVar13._12_2_ = 0x20;
      auVar13._14_2_ = 0x20;
      auVar13._16_2_ = 0x20;
      auVar13._18_2_ = 0x20;
      auVar13._20_2_ = 0x20;
      auVar13._22_2_ = 0x20;
      auVar13._24_2_ = 0x20;
      auVar13._26_2_ = 0x20;
      auVar13._28_2_ = 0x20;
      auVar13._30_2_ = 0x20;
      auVar22 = vpmaddwd_avx2(auVar24,auVar13);
      auVar13 = vpaddd_avx2(auVar22,auVar18);
      auVar32 = vpsubd_avx2(auVar22,auVar18);
      auVar22 = vpmaddwd_avx2(auVar20,_DAT_0017f740);
      auVar20 = vpmaddwd_avx2(auVar24,_DAT_0017f760);
      auVar18 = vpaddd_avx2(auVar20,auVar22);
      auVar22 = vpsubd_avx2(auVar20,auVar22);
      auVar20 = vpsubd_avx2(auVar13,auVar12);
      auVar15._4_4_ = iVar16;
      auVar15._0_4_ = iVar16;
      auVar15._8_4_ = iVar16;
      auVar15._12_4_ = iVar16;
      auVar15._16_4_ = iVar16;
      auVar15._20_4_ = iVar16;
      auVar15._24_4_ = iVar16;
      auVar15._28_4_ = iVar16;
      auVar12 = vpaddd_avx2(auVar12,auVar15);
      auVar12 = vpaddd_avx2(auVar12,auVar13);
      auVar24 = vpsubd_avx2(auVar18,auVar23);
      auVar23 = vpaddd_avx2(auVar23,auVar15);
      auVar23 = vpaddd_avx2(auVar18,auVar23);
      auVar18 = vpsubd_avx2(auVar22,auVar26);
      auVar26 = vpaddd_avx2(auVar26,auVar15);
      auVar26 = vpaddd_avx2(auVar26,auVar22);
      auVar22 = vpsubd_avx2(auVar32,auVar28);
      auVar28 = vpaddd_avx2(auVar28,auVar15);
      auVar28 = vpaddd_avx2(auVar28,auVar32);
      auVar13 = vpaddd_avx2(auVar12,auVar25);
      auVar32 = vpsubd_avx2(auVar12,auVar25);
      auVar12 = vpaddd_avx2(auVar23,auVar29);
      auVar14 = vpsubd_avx2(auVar23,auVar29);
      auVar29 = vpaddd_avx2(auVar26,auVar30);
      auVar26 = vpsubd_avx2(auVar26,auVar30);
      auVar23 = vpaddd_avx2(auVar31,auVar28);
      auVar28 = vpsubd_avx2(auVar28,auVar31);
      auVar25 = vpaddd_avx2(auVar22,auVar15);
      auVar30 = vpaddd_avx2(auVar25,auVar8);
      auVar22 = vpsubd_avx2(auVar25,auVar8);
      auVar25 = vpaddd_avx2(auVar18,auVar15);
      auVar31 = vpaddd_avx2(auVar9,auVar25);
      auVar18 = vpsubd_avx2(auVar25,auVar9);
      auVar25 = vpaddd_avx2(auVar24,auVar15);
      auVar8 = vpaddd_avx2(auVar25,auVar10);
      auVar24 = vpsubd_avx2(auVar25,auVar10);
      auVar25 = vpaddd_avx2(auVar20,auVar15);
      auVar10 = vpsrad_avx2(auVar13,ZEXT416((uint)shift));
      auVar9 = vpaddd_avx2(auVar25,auVar11);
      auVar11 = vpsubd_avx2(auVar25,auVar11);
      auVar25 = vpsrad_avx2(auVar30,ZEXT416((uint)shift));
      auVar25 = vpackssdw_avx2(auVar10,auVar25);
      auVar27 = ZEXT416((uint)shift);
      auVar30 = vpsrad_avx2(auVar12,auVar27);
      auVar10 = vpsrad_avx2(auVar29,auVar27);
      auVar29 = vpsrad_avx2(auVar31,auVar27);
      auVar31 = vpsrad_avx2(auVar8,auVar27);
      auVar29 = vpackssdw_avx2(auVar30,auVar29);
      auVar30 = vpackssdw_avx2(auVar10,auVar31);
      auVar27 = ZEXT416((uint)shift);
      auVar31 = vpsrad_avx2(auVar23,auVar27);
      auVar8 = vpsrad_avx2(auVar9,auVar27);
      auVar9 = vpsrad_avx2(auVar11,auVar27);
      auVar31 = vpackssdw_avx2(auVar31,auVar8);
      auVar8 = vpsrad_avx2(auVar28,auVar27);
      auVar8 = vpackssdw_avx2(auVar9,auVar8);
      auVar9 = vpsrad_avx2(auVar24,auVar27);
      auVar10 = vpsrad_avx2(auVar18,auVar27);
      auVar11 = vpsrad_avx2(auVar26,auVar27);
      auVar12 = vpsrad_avx2(auVar14,auVar27);
      auVar9 = vpackssdw_avx2(auVar9,auVar11);
      auVar10 = vpackssdw_avx2(auVar10,auVar12);
      auVar11 = vpsrad_avx2(auVar22,ZEXT416((uint)shift));
      auVar12 = vpsrad_avx2(auVar32,ZEXT416((uint)shift));
      auVar11 = vpackssdw_avx2(auVar11,auVar12);
      auVar12 = vpunpcklwd_avx2(auVar25,auVar30);
      auVar25 = vpunpckhwd_avx2(auVar25,auVar30);
      auVar30 = vpunpcklwd_avx2(auVar29,auVar31);
      auVar29 = vpunpckhwd_avx2(auVar29,auVar31);
      auVar31 = vpunpcklwd_avx2(auVar12,auVar30);
      auVar30 = vpunpckhwd_avx2(auVar12,auVar30);
      auVar12 = vpunpcklwd_avx2(auVar25,auVar29);
      auVar25 = vpunpckhwd_avx2(auVar25,auVar29);
      auVar23 = vpunpcklqdq_avx2(auVar31,auVar12);
      auVar31 = vpunpckhqdq_avx2(auVar31,auVar12);
      auVar26 = vpunpcklqdq_avx2(auVar30,auVar25);
      auVar12 = vpunpckhqdq_avx2(auVar30,auVar25);
      auVar30 = vpunpcklwd_avx2(auVar8,auVar10);
      auVar25 = vpunpckhwd_avx2(auVar8,auVar10);
      auVar8 = vpunpcklwd_avx2(auVar9,auVar11);
      auVar29 = vpunpckhwd_avx2(auVar9,auVar11);
      auVar9 = vpunpcklwd_avx2(auVar30,auVar8);
      auVar30 = vpunpckhwd_avx2(auVar30,auVar8);
      auVar8 = vpunpcklwd_avx2(auVar25,auVar29);
      auVar25 = vpunpckhwd_avx2(auVar25,auVar29);
      auVar29 = vpunpcklqdq_avx2(auVar9,auVar8);
      auVar9 = vpunpckhqdq_avx2(auVar9,auVar8);
      auVar10 = vpunpcklqdq_avx2(auVar30,auVar25);
      auVar11 = vpunpckhqdq_avx2(auVar30,auVar25);
      auVar25._0_16_ = ZEXT116(0) * auVar29._0_16_ + ZEXT116(1) * auVar23._0_16_;
      auVar25._16_16_ = ZEXT116(0) * auVar23._16_16_ + ZEXT116(1) * auVar29._0_16_;
      auVar8 = vperm2i128_avx2(auVar23,auVar29,0x31);
      auVar29._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar31._0_16_;
      auVar29._16_16_ = ZEXT116(0) * auVar31._16_16_ + ZEXT116(1) * auVar9._0_16_;
      auVar9 = vperm2i128_avx2(auVar31,auVar9,0x31);
      auVar30._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar26._0_16_;
      auVar30._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * auVar10._0_16_;
      auVar10 = vperm2i128_avx2(auVar26,auVar10,0x31);
      auVar31._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar12._0_16_;
      auVar31._16_16_ = ZEXT116(0) * auVar12._16_16_ + ZEXT116(1) * auVar11._0_16_;
      auVar11 = vperm2i128_avx2(auVar12,auVar11,0x31);
      if (bit_depth != 0xf) {
        auVar14._2_2_ = sVar19;
        auVar14._0_2_ = sVar19;
        auVar14._4_2_ = sVar19;
        auVar14._6_2_ = sVar19;
        auVar14._8_2_ = sVar19;
        auVar14._10_2_ = sVar19;
        auVar14._12_2_ = sVar19;
        auVar14._14_2_ = sVar19;
        auVar14._16_2_ = sVar19;
        auVar14._18_2_ = sVar19;
        auVar14._20_2_ = sVar19;
        auVar14._22_2_ = sVar19;
        auVar14._24_2_ = sVar19;
        auVar14._26_2_ = sVar19;
        auVar14._28_2_ = sVar19;
        auVar14._30_2_ = sVar19;
        auVar25 = vpminsw_avx2(auVar14,auVar25);
        auVar29 = vpminsw_avx2(auVar29,auVar14);
        auVar30 = vpminsw_avx2(auVar30,auVar14);
        auVar31 = vpminsw_avx2(auVar31,auVar14);
        auVar8 = vpminsw_avx2(auVar14,auVar8);
        auVar9 = vpminsw_avx2(auVar14,auVar9);
        auVar10 = vpminsw_avx2(auVar10,auVar14);
        auVar11 = vpminsw_avx2(auVar11,auVar14);
        auVar12._2_2_ = sVar21;
        auVar12._0_2_ = sVar21;
        auVar12._4_2_ = sVar21;
        auVar12._6_2_ = sVar21;
        auVar12._8_2_ = sVar21;
        auVar12._10_2_ = sVar21;
        auVar12._12_2_ = sVar21;
        auVar12._14_2_ = sVar21;
        auVar12._16_2_ = sVar21;
        auVar12._18_2_ = sVar21;
        auVar12._20_2_ = sVar21;
        auVar12._22_2_ = sVar21;
        auVar12._24_2_ = sVar21;
        auVar12._26_2_ = sVar21;
        auVar12._28_2_ = sVar21;
        auVar12._30_2_ = sVar21;
        auVar25 = vpmaxsw_avx2(auVar12,auVar25);
        auVar29 = vpmaxsw_avx2(auVar12,auVar29);
        auVar30 = vpmaxsw_avx2(auVar12,auVar30);
        auVar31 = vpmaxsw_avx2(auVar12,auVar31);
        auVar8 = vpmaxsw_avx2(auVar12,auVar8);
        auVar9 = vpmaxsw_avx2(auVar12,auVar9);
        auVar10 = vpmaxsw_avx2(auVar12,auVar10);
        auVar11 = vpmaxsw_avx2(auVar11,auVar12);
      }
      *(undefined1 (*) [32])dst = auVar25;
      *(undefined1 (*) [32])((long)dst + 0x20) = auVar29;
      *(undefined1 (*) [32])((long)dst + 0x40) = auVar30;
      *(undefined1 (*) [32])((long)dst + 0x60) = auVar31;
      *(undefined1 (*) [32])((long)dst + 0x80) = auVar8;
      *(undefined1 (*) [32])((long)dst + 0xa0) = auVar9;
      *(undefined1 (*) [32])((long)dst + 0xc0) = auVar10;
      *(undefined1 (*) [32])((long)dst + 0xe0) = auVar11;
      dst = (s16 *)((long)dst + 0x100);
      uVar17 = uVar17 + 8;
    } while (uVar17 < (uint)line);
  }
  return;
}

Assistant:

void dct2_butterfly_h16_avx2(s16* src, int i_src, s16* dst, int line, int shift, int bit_depth)
{
    const __m256i c16_p43_p45 = _mm256_set1_epi32(0x002B002D);		//row0 
    const __m256i c16_p35_p40 = _mm256_set1_epi32(0x00230028);
    const __m256i c16_p21_p29 = _mm256_set1_epi32(0x0015001D);
    const __m256i c16_p04_p13 = _mm256_set1_epi32(0x0004000D);
    const __m256i c16_p29_p43 = _mm256_set1_epi32(0x001D002B);		//row1
    const __m256i c16_n21_p04 = _mm256_set1_epi32(0xFFEB0004);
    const __m256i c16_n45_n40 = _mm256_set1_epi32(0xFFD3FFD8);
    const __m256i c16_n13_n35 = _mm256_set1_epi32(0xFFF3FFDD);
    const __m256i c16_p04_p40 = _mm256_set1_epi32(0x00040028);		//row2
    const __m256i c16_n43_n35 = _mm256_set1_epi32(0xFFD5FFDD);
    const __m256i c16_p29_n13 = _mm256_set1_epi32(0x001DFFF3);
    const __m256i c16_p21_p45 = _mm256_set1_epi32(0x0015002D);
    const __m256i c16_n21_p35 = _mm256_set1_epi32(0xFFEB0023);		//row3
    const __m256i c16_p04_n43 = _mm256_set1_epi32(0x0004FFD5);
    const __m256i c16_p13_p45 = _mm256_set1_epi32(0x000D002D);
    const __m256i c16_n29_n40 = _mm256_set1_epi32(0xFFE3FFD8);
    const __m256i c16_n40_p29 = _mm256_set1_epi32(0xFFD8001D);		//row4
    const __m256i c16_p45_n13 = _mm256_set1_epi32(0x002DFFF3);
    const __m256i c16_n43_n04 = _mm256_set1_epi32(0xFFD5FFFC);
    const __m256i c16_p35_p21 = _mm256_set1_epi32(0x00230015);
    const __m256i c16_n45_p21 = _mm256_set1_epi32(0xFFD30015);		//row5
    const __m256i c16_p13_p29 = _mm256_set1_epi32(0x000D001D);
    const __m256i c16_p35_n43 = _mm256_set1_epi32(0x0023FFD5);
    const __m256i c16_n40_p04 = _mm256_set1_epi32(0xFFD80004);
    const __m256i c16_n35_p13 = _mm256_set1_epi32(0xFFDD000D);		//row6
    const __m256i c16_n40_p45 = _mm256_set1_epi32(0xFFD8002D);
    const __m256i c16_p04_p21 = _mm256_set1_epi32(0x00040015);
    const __m256i c16_p43_n29 = _mm256_set1_epi32(0x002BFFE3);
    const __m256i c16_n13_p04 = _mm256_set1_epi32(0xFFF30004);		//row7
    const __m256i c16_n29_p21 = _mm256_set1_epi32(0xFFE30015);
    const __m256i c16_n40_p35 = _mm256_set1_epi32(0xFFD80023);
    const __m256i c16_n45_p43 = _mm256_set1_epi32(0xFFD3002B);
    const __m256i c16_p38_p44 = _mm256_set1_epi32(0x0026002C);
    const __m256i c16_p09_p25 = _mm256_set1_epi32(0x00090019);
    const __m256i c16_n09_p38 = _mm256_set1_epi32(0xFFF70026);
    const __m256i c16_n25_n44 = _mm256_set1_epi32(0xFFE7FFD4);
    const __m256i c16_n44_p25 = _mm256_set1_epi32(0xFFD40019);
    const __m256i c16_p38_p09 = _mm256_set1_epi32(0x00260009);
    const __m256i c16_n25_p09 = _mm256_set1_epi32(0xFFE70009);
    const __m256i c16_n44_p38 = _mm256_set1_epi32(0xFFD40026);
    const __m256i c16_p17_p42 = _mm256_set1_epi32(0x0011002A);
    const __m256i c16_n42_p17 = _mm256_set1_epi32(0xFFD60011);
    const __m256i c16_n32_p32 = _mm256_set1_epi32(0xFFE00020);
    const __m256i c16_p32_p32 = _mm256_set1_epi32(0x00200020);
    int i;
    __m256i c32_off = _mm256_set1_epi32(1 << (shift - 1));
    __m128i src00, src01, src02, src03, src04, src05, src06, src07;
    __m128i src08, src09, src10, src11, src12, src13, src14, src15;
    __m128i ss0, ss1, ss2, ss3, ss4, ss5, ss6, ss7;
    __m256i res00, res01, res02, res03, res04, res05, res06, res07;
    __m256i t0, t1, t2, t3, t4, t5, t6, t7;
    __m256i t00, t01, t02, t03;
    __m256i o0, o1, o2, o3, o4, o5, o6, o7;
    __m256i eo0, eo1, eo2, eo3;
    __m256i eeo0, eeo1;
    __m256i eee0, eee1;

    for (i = 0; i < line; i += 8)
    {
        src01 = _mm_load_si128((const __m128i*)&src[1 * i_src + i]);    // [17 16 15 14 13 12 11 10]
        src03 = _mm_load_si128((const __m128i*)&src[3 * i_src + i]);    // [37 36 35 34 33 32 31 30]
        src05 = _mm_load_si128((const __m128i*)&src[5 * i_src + i]);    // [57 56 55 54 53 52 51 50]
        src07 = _mm_load_si128((const __m128i*)&src[7 * i_src + i]);    // [77 76 75 74 73 72 71 70]
        src09 = _mm_load_si128((const __m128i*)&src[9 * i_src + i]);
        src11 = _mm_load_si128((const __m128i*)&src[11 * i_src + i]);
        src13 = _mm_load_si128((const __m128i*)&src[13 * i_src + i]);
        src15 = _mm_load_si128((const __m128i*)&src[15 * i_src + i]);

        ss0 = _mm_unpacklo_epi16(src01, src03);
        ss1 = _mm_unpacklo_epi16(src05, src07);
        ss2 = _mm_unpacklo_epi16(src09, src11);
        ss3 = _mm_unpacklo_epi16(src13, src15);
        ss4 = _mm_unpackhi_epi16(src01, src03);
        ss5 = _mm_unpackhi_epi16(src05, src07);
        ss6 = _mm_unpackhi_epi16(src09, src11);
        ss7 = _mm_unpackhi_epi16(src13, src15);

        t0 = _mm256_set_m128i(ss4, ss0);
        t1 = _mm256_set_m128i(ss5, ss1);
        t2 = _mm256_set_m128i(ss6, ss2);
        t3 = _mm256_set_m128i(ss7, ss3);
#define COMPUTE_ROW(row0103, row0507, row0911, row1315, c0103, c0507, c0911, c1315, row) \
        t00 = _mm256_madd_epi16(row0103, c0103); \
        t01 = _mm256_madd_epi16(row0507, c0507); \
        t02 = _mm256_madd_epi16(row0911, c0911); \
        t03 = _mm256_madd_epi16(row1315, c1315); \
	    t00 = _mm256_add_epi32(t00, t01); \
	    t01 = _mm256_add_epi32(t02, t03); \
	    row = _mm256_add_epi32(t00, t01);

        COMPUTE_ROW(t0, t1, t2, t3, c16_p43_p45, c16_p35_p40, c16_p21_p29, c16_p04_p13, o0)
        COMPUTE_ROW(t0, t1, t2, t3, c16_p29_p43, c16_n21_p04, c16_n45_n40, c16_n13_n35, o1)
        COMPUTE_ROW(t0, t1, t2, t3, c16_p04_p40, c16_n43_n35, c16_p29_n13, c16_p21_p45, o2)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n21_p35, c16_p04_n43, c16_p13_p45, c16_n29_n40, o3)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n40_p29, c16_p45_n13, c16_n43_n04, c16_p35_p21, o4)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n45_p21, c16_p13_p29, c16_p35_n43, c16_n40_p04, o5)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n35_p13, c16_n40_p45, c16_p04_p21, c16_p43_n29, o6)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n13_p04, c16_n29_p21, c16_n40_p35, c16_n45_p43, o7)

#undef COMPUTE_ROW

        src00 = _mm_load_si128((const __m128i*)&src[0 * i_src + i]);    // [07 06 05 04 03 02 01 00]
        src02 = _mm_load_si128((const __m128i*)&src[2 * i_src + i]);    // [27 26 25 24 23 22 21 20]
        src04 = _mm_load_si128((const __m128i*)&src[4 * i_src + i]);    // [47 46 45 44 43 42 41 40]
        src06 = _mm_load_si128((const __m128i*)&src[6 * i_src + i]);    // [67 66 65 64 63 62 61 60]
        src08 = _mm_load_si128((const __m128i*)&src[8 * i_src + i]);
        src10 = _mm_load_si128((const __m128i*)&src[10 * i_src + i]);
        src12 = _mm_load_si128((const __m128i*)&src[12 * i_src + i]);
        src14 = _mm_load_si128((const __m128i*)&src[14 * i_src + i]);

        ss0 = _mm_unpacklo_epi16(src02, src06);
        ss1 = _mm_unpacklo_epi16(src10, src14);
        ss2 = _mm_unpacklo_epi16(src04, src12);
        ss3 = _mm_unpacklo_epi16(src00, src08);
        ss4 = _mm_unpackhi_epi16(src02, src06);
        ss5 = _mm_unpackhi_epi16(src10, src14);
        ss6 = _mm_unpackhi_epi16(src04, src12);
        ss7 = _mm_unpackhi_epi16(src00, src08);

        t4 = _mm256_set_m128i(ss4, ss0);
        t5 = _mm256_set_m128i(ss5, ss1);
        t6 = _mm256_set_m128i(ss6, ss2);
        t7 = _mm256_set_m128i(ss7, ss3);

        eo0 = _mm256_add_epi32(_mm256_madd_epi16(t4, c16_p38_p44), _mm256_madd_epi16(t5, c16_p09_p25)); // EO0
        eo1 = _mm256_add_epi32(_mm256_madd_epi16(t4, c16_n09_p38), _mm256_madd_epi16(t5, c16_n25_n44)); // EO1
        eo2 = _mm256_add_epi32(_mm256_madd_epi16(t4, c16_n44_p25), _mm256_madd_epi16(t5, c16_p38_p09)); // EO2
        eo3 = _mm256_add_epi32(_mm256_madd_epi16(t4, c16_n25_p09), _mm256_madd_epi16(t5, c16_n44_p38)); // EO3

        eeo0 = _mm256_madd_epi16(t6, c16_p17_p42);
        eeo1 = _mm256_madd_epi16(t6, c16_n42_p17);

        eee0 = _mm256_madd_epi16(t7, c16_p32_p32);
        eee1 = _mm256_madd_epi16(t7, c16_n32_p32);

        {
            const __m256i ee0 = _mm256_add_epi32(eee0, eeo0);       // EE0 = EEE0 + EEO0
            const __m256i ee1 = _mm256_add_epi32(eee1, eeo1);       // EE1 = EEE1 + EEO1
            const __m256i ee3 = _mm256_sub_epi32(eee0, eeo0);       // EE2 = EEE0 - EEO0
            const __m256i ee2 = _mm256_sub_epi32(eee1, eeo1);       // EE3 = EEE1 - EEO1

            const __m256i e0 = _mm256_add_epi32(ee0, eo0);          // E0 = EE0 + EO0
            const __m256i e1 = _mm256_add_epi32(ee1, eo1);          // E1 = EE1 + EO1
            const __m256i e2 = _mm256_add_epi32(ee2, eo2);          // E2 = EE2 + EO2
            const __m256i e3 = _mm256_add_epi32(ee3, eo3);          // E3 = EE3 + EO3
            const __m256i e7 = _mm256_sub_epi32(ee0, eo0);          // E0 = EE0 - EO0
            const __m256i e6 = _mm256_sub_epi32(ee1, eo1);          // E1 = EE1 - EO1
            const __m256i e5 = _mm256_sub_epi32(ee2, eo2);          // E2 = EE2 - EO2
            const __m256i e4 = _mm256_sub_epi32(ee3, eo3);          // E3 = EE3 - EO3

            const __m256i t10 = _mm256_add_epi32(e0, c32_off);      // E0 + off
            const __m256i t11 = _mm256_add_epi32(e1, c32_off);      // E1 + off
            const __m256i t12 = _mm256_add_epi32(e2, c32_off);      // E2 + off
            const __m256i t13 = _mm256_add_epi32(e3, c32_off);      // E3 + off
            const __m256i t14 = _mm256_add_epi32(e4, c32_off);      // E4 + off
            const __m256i t15 = _mm256_add_epi32(e5, c32_off);      // E5 + off
            const __m256i t16 = _mm256_add_epi32(e6, c32_off);      // E6 + off
            const __m256i t17 = _mm256_add_epi32(e7, c32_off);      // E7 + off

            __m256i T20 = _mm256_add_epi32(t10, o0);                // E0 + O0 + off
            __m256i T21 = _mm256_add_epi32(t11, o1);                // E1 + O1 + off
            __m256i T22 = _mm256_add_epi32(t12, o2);                // E2 + O2 + off
            __m256i T23 = _mm256_add_epi32(t13, o3);                // E3 + O3 + off
            __m256i T24 = _mm256_add_epi32(t14, o4);                // E4
            __m256i T25 = _mm256_add_epi32(t15, o5);                // E5
            __m256i T26 = _mm256_add_epi32(t16, o6);                // E6
            __m256i T27 = _mm256_add_epi32(t17, o7);                // E7
            __m256i T2F = _mm256_sub_epi32(t10, o0);                // E0 - O0 + off
            __m256i T2E = _mm256_sub_epi32(t11, o1);                // E1 - O1 + off
            __m256i T2D = _mm256_sub_epi32(t12, o2);                // E2 - O2 + off
            __m256i T2C = _mm256_sub_epi32(t13, o3);                // E3 - O3 + off
            __m256i T2B = _mm256_sub_epi32(t14, o4);                // E4
            __m256i T2A = _mm256_sub_epi32(t15, o5);                // E5
            __m256i T29 = _mm256_sub_epi32(t16, o6);                // E6
            __m256i T28 = _mm256_sub_epi32(t17, o7);                // E7

            T20 = _mm256_srai_epi32(T20, shift);                    // [30 20 10 00]
            T21 = _mm256_srai_epi32(T21, shift);                    // [31 21 11 01]
            T22 = _mm256_srai_epi32(T22, shift);                    // [32 22 12 02]
            T23 = _mm256_srai_epi32(T23, shift);                    // [33 23 13 03]
            T24 = _mm256_srai_epi32(T24, shift);                    // [33 24 14 04]
            T25 = _mm256_srai_epi32(T25, shift);                    // [35 25 15 05]
            T26 = _mm256_srai_epi32(T26, shift);                    // [36 26 16 06]
            T27 = _mm256_srai_epi32(T27, shift);                    // [37 27 17 07]
            T28 = _mm256_srai_epi32(T28, shift);                    // [30 20 10 00] x8
            T29 = _mm256_srai_epi32(T29, shift);                    // [31 21 11 01] x9
            T2A = _mm256_srai_epi32(T2A, shift);                    // [32 22 12 02] xA
            T2B = _mm256_srai_epi32(T2B, shift);                    // [33 23 13 03] xB
            T2C = _mm256_srai_epi32(T2C, shift);                    // [33 24 14 04] xC
            T2D = _mm256_srai_epi32(T2D, shift);                    // [35 25 15 05] xD
            T2E = _mm256_srai_epi32(T2E, shift);                    // [36 26 16 06] xE
            T2F = _mm256_srai_epi32(T2F, shift);                    // [37 27 17 07] xF

            // transpose 16x8 --> 8x16
            TRANSPOSE_16x8_32BIT_16BIT(T20, T21, T22, T23, T24, T25, T26, T27, 
                T28, T29, T2A, T2B, T2C, T2D, T2E, T2F, res00, res01, res02, res03, res04, res05, res06, res07);
        }
        if (bit_depth != MAX_TX_DYNAMIC_RANGE) {
            __m256i max_val = _mm256_set1_epi16((1 << bit_depth) - 1);
            __m256i min_val = _mm256_set1_epi16(-(1 << bit_depth));

            res00 = _mm256_min_epi16(res00, max_val);
            res01 = _mm256_min_epi16(res01, max_val);
            res02 = _mm256_min_epi16(res02, max_val);
            res03 = _mm256_min_epi16(res03, max_val);
            res04 = _mm256_min_epi16(res04, max_val);
            res05 = _mm256_min_epi16(res05, max_val);
            res06 = _mm256_min_epi16(res06, max_val);
            res07 = _mm256_min_epi16(res07, max_val);
            res00 = _mm256_max_epi16(res00, min_val);
            res01 = _mm256_max_epi16(res01, min_val);
            res02 = _mm256_max_epi16(res02, min_val);
            res03 = _mm256_max_epi16(res03, min_val);
            res04 = _mm256_max_epi16(res04, min_val);
            res05 = _mm256_max_epi16(res05, min_val);
            res06 = _mm256_max_epi16(res06, min_val);
            res07 = _mm256_max_epi16(res07, min_val);

        }

        _mm256_store_si256((__m256i*)&dst[16 * 0], res00);
        _mm256_store_si256((__m256i*)&dst[16 * 1], res01);
        _mm256_store_si256((__m256i*)&dst[16 * 2], res02);
        _mm256_store_si256((__m256i*)&dst[16 * 3], res03);
        _mm256_store_si256((__m256i*)&dst[16 * 4], res04);
        _mm256_store_si256((__m256i*)&dst[16 * 5], res05);
        _mm256_store_si256((__m256i*)&dst[16 * 6], res06);
        _mm256_store_si256((__m256i*)&dst[16 * 7], res07);

        dst += 16*8; // 8 rows
    }
}